

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O0

void anon_unknown.dwarf_4210c::test(_func_M44f_M44f_ptr_Order *matrixEulerMatrix,Order order)

{
  ostream *poVar1;
  int in_ESI;
  int k;
  int j;
  int i;
  Order in_stack_0000006c;
  _func_M44f_M44f_ptr_Order *in_stack_00000070;
  Order in_stack_000000a4;
  _func_M44f_M44f_ptr_Order *in_stack_000000a8;
  V3f *in_stack_000000b0;
  Vec3<float> local_2c;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = in_ESI;
  poVar1 = std::operator<<((ostream *)&std::cout,"order = ");
  local_10 = (int)std::setbase(0x10);
  poVar1 = std::operator<<(poVar1,(_Setbase)local_10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  local_14 = (int)std::setbase(10);
  poVar1 = std::operator<<(poVar1,(_Setbase)local_14);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  testRandomAngles(in_stack_00000070,in_stack_0000006c);
  for (local_18 = 0; local_18 < 0x168; local_18 = local_18 + 0x5a) {
    for (local_1c = 0; local_1c < 0x168; local_1c = local_1c + 0x5a) {
      for (local_20 = 0; local_20 < 0x168; local_20 = local_20 + 0x5a) {
        Imath_3_2::Vec3<float>::Vec3(&local_2c,(float)local_18,(float)local_1c,(float)local_20);
        testAngles(in_stack_000000b0,in_stack_000000a8,in_stack_000000a4);
      }
    }
  }
  return;
}

Assistant:

void
test (
    M44f (*matrixEulerMatrix) (const M44f&, Eulerf::Order), Eulerf::Order order)
{
    cout << "order = " << setbase (16) << int (order) << setbase (10) << endl;

    // cout << "random angles" << endl;

    testRandomAngles (matrixEulerMatrix, order);

    // cout << "special angles" << endl;

    for (int i = 0; i < 360; i += 90)
        for (int j = 0; j < 360; j += 90)
            for (int k = 0; k < 360; k += 90)
                testAngles (V3f (float(i), float(j), float(k)), matrixEulerMatrix, order);
}